

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

ReadFileResult cmCMakePresetsGraphInternal::PresetOptionalIntHelper(optional<int> *out,Value *value)

{
  ReadFileResult RVar1;
  Value *local_18;
  
  if (PresetOptionalIntHelper(std::optional<int>&,Json::Value_const*)::helper == '\0') {
    PresetOptionalIntHelper();
  }
  local_18 = value;
  if (PresetOptionalIntHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*PresetOptionalIntHelper::helper._M_invoker)
                      ((_Any_data *)&PresetOptionalIntHelper::helper,out,&local_18);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetOptionalIntHelper(
  cm::optional<int>& out, const Json::Value* value)
{
  static auto const helper =
    JSONHelperBuilder::Optional<int>(ReadFileResult::READ_OK, PresetIntHelper);

  return helper(out, value);
}